

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::convert_float_to_string_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t col,
          uint32_t row)

{
  char cVar1;
  runtime_error *this_00;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  char *comment;
  char print_buffer [32];
  SPIRType out_type;
  SPIRType in_type;
  char (*in_stack_fffffffffffffc90) [5];
  char *local_360;
  float local_354;
  undefined1 *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  undefined1 *local_338 [2];
  undefined1 local_328 [16];
  string local_318;
  char local_2f8 [40];
  string local_2d0;
  undefined1 *local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined1 local_298 [32];
  undefined1 *local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined1 local_260 [8];
  undefined4 local_258;
  undefined2 local_254;
  undefined4 local_250;
  undefined1 *local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined1 local_230 [32];
  undefined1 *local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined1 local_1f8 [32];
  undefined7 local_1d8;
  undefined4 uStack_1d1;
  undefined8 local_1cc;
  undefined8 uStack_1c4;
  undefined4 local_1bc;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1b8;
  undefined **local_180;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 local_164;
  undefined1 *local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined1 local_148 [32];
  undefined1 *local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined1 local_110 [8];
  undefined4 local_108;
  undefined2 local_104;
  undefined4 local_100;
  undefined1 *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined1 auStack_e0 [32];
  undefined1 *local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined1 auStack_a8 [32];
  undefined7 local_88;
  undefined4 uStack_81;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_354 = (c->m).c[col].r[row].f32;
  if ((!NAN(local_354) && !NAN(local_354)) && ABS(local_354) != INFINITY) {
    format_float_abi_cxx11_(&local_2d0,this,local_354);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    if ((this->backend).float_literal_suffix != true) {
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  uVar4 = 0x81;
  if ((this->options).es != false) {
    uVar4 = 299;
  }
  if (uVar4 < (this->options).version) {
    local_2b0 = local_298;
    local_2d0._M_string_length._0_4_ = 0;
    local_2d0._M_dataplus._M_p = (pointer)&PTR__SPIRType_003a8f58;
    local_2d0.field_2._12_4_ = 1;
    uStack_2a8 = 0;
    local_2a0 = 8;
    local_278 = local_260;
    uStack_270 = 0;
    local_268 = 8;
    local_258 = 0;
    local_254 = 0;
    local_250 = 8;
    local_340 = local_230;
    uStack_240 = 0;
    local_238 = 8;
    local_348 = local_1f8;
    uStack_208 = 0;
    local_200 = 8;
    local_1d8 = 0;
    uStack_1d1 = 0;
    local_1bc = 0;
    local_1cc = 0;
    uStack_1c4 = 0;
    local_1b8._M_buckets = &local_1b8._M_single_bucket;
    local_160 = local_148;
    local_178 = 0;
    local_180 = &PTR__SPIRType_003a8f58;
    local_174 = 0x15;
    local_164 = 1;
    uStack_158 = 0;
    local_150 = 8;
    uStack_120 = 0;
    local_118 = 8;
    local_108 = 0;
    local_104 = 0;
    local_100 = 8;
    local_350 = auStack_e0;
    uStack_f0 = 0;
    local_e8 = 8;
    uStack_b8 = 0;
    local_b0 = 8;
    local_88 = 0;
    uStack_81 = 0;
    local_6c = 0;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_7c = 0;
    uStack_74 = 0;
    local_1b8._M_bucket_count = 1;
    local_68._M_bucket_count = 1;
    local_1b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1b8._M_element_count = 0;
    local_1b8._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    uStack_170 = 8;
    local_1b8._M_rehash_policy._M_next_resize = 0;
    local_1b8._M_single_bucket = (__node_base_ptr)0x0;
    local_2d0._12_8_ = 0xd00000016;
    uStack_168 = 1;
    local_2d0.field_2._4_8_ = 0x100000020;
    uStack_16c = 0x20;
    local_248 = local_340;
    local_210 = local_348;
    local_128 = local_110;
    local_f8 = local_350;
    local_c0 = auStack_a8;
    snprintf(local_2f8,0x20,"0x%xu",(ulong)(c->m).c[col].r[row].u32);
    local_360 = "inf";
    if (-INFINITY < local_354) {
      if (NAN(local_354)) {
        local_360 = "nan";
      }
    }
    else {
      local_360 = "-inf";
    }
    (*(this->super_Compiler)._vptr_Compiler[0x3b])(local_338,this,&local_2d0,&local_180);
    join<std::__cxx11::string,char_const(&)[2],char(&)[32],char_const(&)[5],char_const*&,char_const(&)[5]>
              (&local_318,(spirv_cross *)local_338,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x309149,
               (char (*) [2])local_2f8,(char (*) [32])" /* ",(char (*) [5])&local_360,
               (char **)" */)",in_stack_fffffffffffffc90);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p);
    }
    if (local_338[0] != local_328) {
      operator_delete(local_338[0]);
    }
    local_180 = &PTR__SPIRType_003a8f58;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    uStack_b8 = 0;
    if (local_c0 != auStack_a8) {
      free(local_c0);
    }
    uStack_f0 = 0;
    if (local_f8 != local_350) {
      free(local_f8);
    }
    uStack_120 = 0;
    if (local_128 != local_110) {
      free(local_128);
    }
    uStack_158 = 0;
    if (local_160 != local_148) {
      free(local_160);
    }
    local_2d0._M_dataplus._M_p = (pointer)&PTR__SPIRType_003a8f58;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_1b8);
    uStack_208 = 0;
    if (local_210 != local_348) {
      free(local_210);
    }
    uStack_240 = 0;
    if (local_248 != local_340) {
      free(local_248);
    }
    uStack_270 = 0;
    if (local_278 != local_260) {
      free(local_278);
    }
    uStack_2a8 = 0;
    if (local_2b0 == local_298) {
      return __return_storage_ptr__;
    }
    free(local_2b0);
    return __return_storage_ptr__;
  }
  if (local_354 < INFINITY) {
    if (local_354 <= -INFINITY) {
      pcVar2 = "(-1.0 / 0.0)";
      if ((this->backend).float_literal_suffix != false) {
        pcVar2 = "(-1.0f / 0.0f)";
      }
      goto LAB_0026bbc3;
    }
    if (!NAN(local_354)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_00,"Cannot represent non-finite floating point constant.");
      *(undefined ***)this_00 = &PTR__runtime_error_003a8f30;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    cVar1 = (this->backend).float_literal_suffix;
    pcVar3 = "(0.0f / 0.0f)";
    pcVar2 = "(0.0 / 0.0)";
  }
  else {
    cVar1 = (this->backend).float_literal_suffix;
    pcVar3 = "(1.0f / 0.0f)";
    pcVar2 = "(1.0 / 0.0)";
  }
  if (cVar1 != '\0') {
    pcVar2 = pcVar3;
  }
LAB_0026bbc3:
  ::std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar2);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_float_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	float float_value = c.scalar_f32(col, row);

	if (std::isnan(float_value) || std::isinf(float_value))
	{
		// Use special representation.
		if (!is_legacy())
		{
			SPIRType out_type { OpTypeFloat };
			SPIRType in_type { OpTypeInt };
			out_type.basetype = SPIRType::Float;
			in_type.basetype = SPIRType::UInt;
			out_type.vecsize = 1;
			in_type.vecsize = 1;
			out_type.width = 32;
			in_type.width = 32;

			char print_buffer[32];
#ifdef _WIN32
			sprintf(print_buffer, "0x%xu", c.scalar(col, row));
#else
			snprintf(print_buffer, sizeof(print_buffer), "0x%xu", c.scalar(col, row));
#endif

			const char *comment = "inf";
			if (float_value == -numeric_limits<float>::infinity())
				comment = "-inf";
			else if (std::isnan(float_value))
				comment = "nan";
			res = join(bitcast_glsl_op(out_type, in_type), "(", print_buffer, " /* ", comment, " */)");
		}
		else
		{
			if (float_value == numeric_limits<float>::infinity())
			{
				if (backend.float_literal_suffix)
					res = "(1.0f / 0.0f)";
				else
					res = "(1.0 / 0.0)";
			}
			else if (float_value == -numeric_limits<float>::infinity())
			{
				if (backend.float_literal_suffix)
					res = "(-1.0f / 0.0f)";
				else
					res = "(-1.0 / 0.0)";
			}
			else if (std::isnan(float_value))
			{
				if (backend.float_literal_suffix)
					res = "(0.0f / 0.0f)";
				else
					res = "(0.0 / 0.0)";
			}
			else
				SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
		}
	}
	else
	{
		res = format_float(float_value);
		if (backend.float_literal_suffix)
			res += "f";
	}

	return res;
}